

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

BOOL SetCurrentDirectoryA(LPCSTR lpPathName)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  undefined1 local_b8 [8];
  stat stat_data;
  LPSTR UnixPathName;
  DWORD local_18;
  int result;
  DWORD dwLastError;
  BOOL bRet;
  LPCSTR lpPathName_local;
  
  result = 0;
  local_18 = 0;
  stat_data.__glibc_reserved[2] = 0;
  _dwLastError = lpPathName;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (lpPathName == (LPCSTR)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    local_18 = 0x7b;
  }
  else {
    sVar2 = strlen(lpPathName);
    if (sVar2 < 0x400) {
      stat_data.__glibc_reserved[2] = (__syscall_slong_t)PAL__strdup(_dwLastError);
      if ((char *)stat_data.__glibc_reserved[2] == (char *)0x0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        local_18 = 8;
      }
      else {
        FILEDosToUnixPathA((LPSTR)stat_data.__glibc_reserved[2]);
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        iVar1 = chdir((char *)stat_data.__glibc_reserved[2]);
        if (iVar1 == 0) {
          result = 1;
        }
        else {
          piVar3 = __errno_location();
          if ((*piVar3 == 0x14) || (piVar3 = __errno_location(), *piVar3 == 2)) {
            iVar1 = stat64((char *)stat_data.__glibc_reserved[2],(stat64 *)local_b8);
            if ((iVar1 == 0) && (((uint)stat_data.st_nlink & 0xf000) == 0x8000)) {
              local_18 = 0x10b;
            }
            else {
              FILEGetProperNotFoundError((LPSTR)stat_data.__glibc_reserved[2],&local_18);
            }
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
          }
          else {
            local_18 = 5;
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            piVar3 = __errno_location();
            strerror(*piVar3);
          }
        }
      }
    }
    else {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      local_18 = 0xce;
    }
  }
  if (local_18 != 0) {
    SetLastError(local_18);
  }
  if (stat_data.__glibc_reserved[2] != 0) {
    PAL_free((void *)stat_data.__glibc_reserved[2]);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return result;
}

Assistant:

BOOL
PALAPI
SetCurrentDirectoryA(
            IN LPCSTR lpPathName)
{
    BOOL bRet = FALSE;
    DWORD dwLastError = 0;
    int result;
    LPSTR UnixPathName = NULL;

    PERF_ENTRY(SetCurrentDirectoryA);
    ENTRY("SetCurrentDirectoryA(lpPathName=%p (%s))\n",
          lpPathName?lpPathName:"NULL",
          lpPathName?lpPathName:"NULL");

   /*check if the given path is null. If so
     return FALSE*/
    if (lpPathName == NULL )
    {
        ERROR("Invalid path/directory name\n");
        dwLastError = ERROR_INVALID_NAME;
        goto done;
    }
    if (strlen(lpPathName) >= MAX_LONGPATH)
    {
        WARN("Path/directory name longer than MAX_LONGPATH characters\n");
        dwLastError = ERROR_FILENAME_EXCED_RANGE;
        goto done;
    }

    UnixPathName = PAL__strdup(lpPathName);
    if (UnixPathName == NULL )
    {
        ERROR("PAL__strdup() failed\n");
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    FILEDosToUnixPathA( UnixPathName );

    TRACE("Attempting to open Unix dir [%s]\n", UnixPathName);
    result = chdir(UnixPathName);

    if ( result == 0 )
    {
        bRet = TRUE;
    }
    else
    {
        if ( errno == ENOTDIR || errno == ENOENT )
        {
            struct stat stat_data;

            if ( stat( UnixPathName, &stat_data) == 0 &&
                 (stat_data.st_mode & S_IFMT) == S_IFREG )
            {
                /* Not a directory, it is a file. */
                dwLastError = ERROR_DIRECTORY;
            }
            else
            {
                FILEGetProperNotFoundError( UnixPathName, &dwLastError );
            }
            TRACE("chdir() failed, path was invalid.\n");
        }
        else
        {
            dwLastError = ERROR_ACCESS_DENIED;
            ERROR("chdir() failed; errno is %d (%s)\n", errno, strerror(errno));
        }
    }


done:
    if( dwLastError )
    {
        SetLastError(dwLastError);
    }

    if(UnixPathName != NULL)
    {
        PAL_free( UnixPathName );
    }

    LOGEXIT("SetCurrentDirectoryA returns BOOL %d\n", bRet);
    PERF_EXIT(SetCurrentDirectoryA);
    return bRet;
}